

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_59f30e::RegexMatch
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  bool bVar1;
  const_reference s;
  cmMakefile *pcVar2;
  size_type sVar3;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string e_1;
  size_type r;
  size_type l;
  string output;
  string local_1c8 [32];
  string_view local_1a8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_178 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string e;
  undefined1 local_100 [8];
  RegularExpression re;
  string *outvar;
  string *regex;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,2);
  re._200_8_ = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,3);
  pcVar2 = cmExecutionStatus::GetMakefile(status);
  cmMakefile::ClearMatches(pcVar2);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_100);
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_100,s);
  if (!bVar1) {
    std::operator+(&local_150,"sub-command REGEX, mode MATCH failed to compile regex \"",s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   &local_150,"\".");
    std::__cxx11::string::~string((string *)&local_150);
    cmExecutionStatus::SetError(status,(string *)local_130);
    args_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_130);
    goto LAB_003688f8;
  }
  local_198 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (args);
  local_188 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_198,4);
  std::__cxx11::string::string(local_1c8);
  local_1a8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1c8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&output.field_2 + 8));
  cmJoin((string *)local_178,&local_188,local_1a8,stack0xfffffffffffffe28);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::string((string *)&l);
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_100,(string *)local_178);
  if (bVar1) {
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    cmMakefile::StoreMatches(pcVar2,(RegularExpression *)local_100);
    sVar3 = cmsys::RegularExpression::start((RegularExpression *)local_100);
    e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)local_100);
    if (e_1.field_2._8_8_ != sVar3) {
      std::__cxx11::string::substr((ulong)local_268,(ulong)local_178);
      std::__cxx11::string::operator=((string *)&l,local_268);
      std::__cxx11::string::~string(local_268);
      goto LAB_0036885c;
    }
    std::operator+(&local_248,"sub-command REGEX, mode MATCH regex \"",s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   &local_248,"\" matched an empty string.");
    std::__cxx11::string::~string((string *)&local_248);
    cmExecutionStatus::SetError(status,(string *)local_228);
    args_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_228);
  }
  else {
LAB_0036885c:
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    name = re._200_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&l);
    cmMakefile::AddDefinition(pcVar2,(string *)name,value);
    args_local._7_1_ = true;
    input.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)local_178);
LAB_003688f8:
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_100);
  return args_local._7_1_;
}

Assistant:

bool RegexMatch(std::vector<std::string> const& args,
                cmExecutionStatus& status)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  status.GetMakefile().ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex)) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    status.SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input)) {
    status.GetMakefile().StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      status.SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}